

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gabby.cc
# Opt level: O0

void ParseArguments(int argc,char **argv)

{
  char *pcVar1;
  runtime_error *prVar2;
  invalid_argument *anon_var_0;
  string local_50 [48];
  char *local_20;
  char *arg;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = argc + -1;
  arg = (char *)(argv + 1);
  do {
    if (argv_local._4_4_ == 0) {
      if (s_filename == (char *)0x0) {
        prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar2,"No rom file given.");
        __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      return;
    }
    local_20 = *(char **)arg;
    if (*local_20 == '-') {
      switch(local_20[1]) {
      case 'b':
        argv_local._4_4_ = argv_local._4_4_ + -1;
        if (argv_local._4_4_ == 0) {
          prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar2,"filename required for -b");
          __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        s_boot_rom_filename = *(char **)(arg + 8);
        arg = arg + 8;
        break;
      case 'f':
        argv_local._4_4_ = argv_local._4_4_ + -1;
        if (argv_local._4_4_ == 0) {
          prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar2,"frame count required for -f");
          __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        pcVar1 = *(char **)(arg + 8);
        arg = arg + 8;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_50,pcVar1,(allocator *)((long)&anon_var_0 + 7));
        s_frames = std::__cxx11::stoi((string *)local_50,(size_t *)0x0,10);
        std::__cxx11::string::~string(local_50);
        std::allocator<char>::~allocator((allocator<char> *)((long)&anon_var_0 + 7));
        break;
      case 'o':
        argv_local._4_4_ = argv_local._4_4_ + -1;
        if (argv_local._4_4_ == 0) {
          prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar2,"filename required for -o");
          __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        s_ppm_filename = *(char **)(arg + 8);
        arg = arg + 8;
        break;
      case 't':
        s_trace = true;
      }
      pcVar1 = s_filename;
    }
    else {
      pcVar1 = local_20;
      if (s_filename != (char *)0x0) {
        prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar2,"multiple filenames");
        __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    s_filename = pcVar1;
    argv_local._4_4_ = argv_local._4_4_ + -1;
    arg = arg + 8;
  } while( true );
}

Assistant:

void ParseArguments(int argc, char** argv) {
  --argc;
  ++argv;
  for (; argc; --argc, ++argv) {
    const char* arg = *argv;
    if (arg[0] == '-') {
      switch (arg[1]) {
        case 'f':
          if (--argc == 0) {
            throw Error("frame count required for -f");
          }
          try {
            s_frames = std::stoi(*++argv);
          } catch (const std::invalid_argument&) {
            throw Error("invalid frame count");
          }
          break;

        case 't':
          s_trace = true;
          break;

        case 'o':
          if (--argc == 0) {
            throw Error("filename required for -o");
          }
          s_ppm_filename = *++argv;
          break;

        case 'b':
          if (--argc == 0) {
            throw Error("filename required for -b");
          }
          s_boot_rom_filename = *++argv;
          break;
      }
    } else if (s_filename) {
      throw Error("multiple filenames");
    } else {
      s_filename = arg;
    }
  }

  if (!s_filename) {
    throw Error("No rom file given.");
  }
}